

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O0

void __thiscall Moc::parseProperty(Moc *this,ClassDef *def,PropertyMode mode)

{
  undefined4 in_EDX;
  long in_RSI;
  parameter_type in_RDI;
  long in_FS_OFFSET;
  PropertyDef propDef;
  Parser *in_stack_fffffffffffffe80;
  PropertyDef *this_00;
  undefined4 in_stack_fffffffffffffe88;
  PropertyDef local_160;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  Parser::next(in_stack_fffffffffffffe80,(Token)((ulong)in_RDI >> 0x20));
  this_00 = &local_160;
  memset(this_00,0xaa,0x158);
  PropertyDef::PropertyDef(this_00);
  QList<PropertyDef>::size((QList<PropertyDef> *)(in_RSI + 0x188));
  createPropertyDef((Moc *)CONCAT44(in_EDX,in_stack_fffffffffffffe88),this_00,
                    (int)((ulong)in_RDI >> 0x20),(PropertyMode)in_RDI);
  Parser::next((Parser *)this_00,(Token)((ulong)in_RDI >> 0x20));
  QList<PropertyDef>::operator+=((QList<PropertyDef> *)this_00,in_RDI);
  PropertyDef::~PropertyDef(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Moc::parseProperty(ClassDef *def, Moc::PropertyMode mode)
{
    next(LPAREN);
    PropertyDef propDef;
    createPropertyDef(propDef, int(def->propertyList.size()), mode);
    next(RPAREN);

    def->propertyList += propDef;
}